

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  char cVar1;
  char *pcVar2;
  int patternLength;
  bool bVar3;
  Location pattern;
  
  skipSpaces(this);
  pcVar2 = this->current_;
  token->start_ = pcVar2;
  if (pcVar2 == this->end_) {
LAB_003eedba:
    token->type_ = tokenEndOfStream;
    goto LAB_003eedbd;
  }
  this->current_ = pcVar2 + 1;
  cVar1 = *pcVar2;
  switch(cVar1) {
  case '\"':
    token->type_ = tokenString;
    bVar3 = readString(this);
    break;
  case '#':
  case '$':
  case '%':
  case '&':
  case '\'':
  case '(':
  case ')':
  case '*':
  case '+':
  case '.':
    goto switchD_003eed69_caseD_23;
  case ',':
    token->type_ = tokenArraySeparator;
    goto LAB_003eedbd;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token->type_ = tokenNumber;
    readNumber(this);
    goto LAB_003eedbd;
  case '/':
    token->type_ = tokenComment;
    bVar3 = readComment(this);
    break;
  case ':':
    token->type_ = tokenMemberSeparator;
    goto LAB_003eedbd;
  default:
    if (cVar1 == '\0') goto LAB_003eedba;
    if (cVar1 == '[') {
      token->type_ = tokenArrayBegin;
      goto LAB_003eedbd;
    }
    if (cVar1 == ']') {
      token->type_ = tokenArrayEnd;
      goto LAB_003eedbd;
    }
    if (cVar1 == 'f') {
      token->type_ = tokenFalse;
      pattern = "alse";
      patternLength = 4;
    }
    else {
      if (cVar1 == 'n') {
        token->type_ = tokenNull;
        pattern = "ull";
      }
      else {
        if (cVar1 != 't') {
          if (cVar1 == '}') {
            token->type_ = tokenObjectEnd;
            goto LAB_003eedbd;
          }
          if (cVar1 == '{') {
            token->type_ = tokenObjectBegin;
            goto LAB_003eedbd;
          }
          goto switchD_003eed69_caseD_23;
        }
        token->type_ = tokenTrue;
        pattern = "rue";
      }
      patternLength = 3;
    }
    bVar3 = match(this,pattern,patternLength);
  }
  if (bVar3 == false) {
switchD_003eed69_caseD_23:
    token->type_ = tokenError;
  }
LAB_003eedbd:
  token->end_ = this->current_;
  return true;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return true;
}